

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldOptions_EditionDefault::~FieldOptions_EditionDefault
          (FieldOptions_EditionDefault *this)

{
  ~FieldOptions_EditionDefault(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

FieldOptions_EditionDefault::~FieldOptions_EditionDefault() {
  // @@protoc_insertion_point(destructor:google.protobuf.FieldOptions.EditionDefault)
  SharedDtor(*this);
}